

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void __thiscall embree::XMLWriter::store(XMLWriter *this,PointLight *light,ssize_t id)

{
  string asStack_98 [32];
  string local_78 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  std::__cxx11::string::string(local_78,"PointLight",(allocator *)&local_58.field_1);
  open(this,(char *)local_78,(int)id);
  std::__cxx11::string::~string(local_78);
  local_58._0_8_ = 0x3f800000;
  local_58._8_8_ = 0;
  local_48 = 0x3f80000000000000;
  uStack_40 = 0;
  local_38 = 0;
  uStack_30 = 0x3f800000;
  local_28 = *(undefined8 *)&(light->P).field_0;
  uStack_20 = *(undefined8 *)((long)&(light->P).field_0 + 8);
  store(this,"AffineSpace",(AffineSpace3fa *)&local_58.field_1);
  store(this,"I",&light->I);
  std::__cxx11::string::string(asStack_98,"PointLight",(allocator *)&local_58.field_1);
  close(this,(int)asStack_98);
  std::__cxx11::string::~string(asStack_98);
  return;
}

Assistant:

void XMLWriter::store(const SceneGraph::PointLight& light, ssize_t id)
  {
    open("PointLight",id);
    store("AffineSpace",AffineSpace3fa::translate(light.P));
    store("I",light.I);
    close("PointLight");
  }